

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cigar.h
# Opt level: O2

Cigar * __thiscall Cigar::operator+(Cigar *__return_storage_ptr__,Cigar *this,Cigar *other)

{
  _Elt_pointer pCVar1;
  _Map_pointer ppCVar2;
  _Elt_pointer pCVar3;
  CigarEntry *c;
  _Elt_pointer entry;
  
  std::deque<CigarEntry,_std::allocator<CigarEntry>_>::deque
            (&__return_storage_ptr__->super_deque<CigarEntry,_std::allocator<CigarEntry>_>,
             &this->super_deque<CigarEntry,_std::allocator<CigarEntry>_>);
  entry = (other->super_deque<CigarEntry,_std::allocator<CigarEntry>_>).
          super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
          _M_start._M_cur;
  pCVar3 = (other->super_deque<CigarEntry,_std::allocator<CigarEntry>_>).
           super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data
           ._M_start._M_last;
  ppCVar2 = (other->super_deque<CigarEntry,_std::allocator<CigarEntry>_>).
            super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
            super__Deque_impl_data._M_start._M_node;
  pCVar1 = (other->super_deque<CigarEntry,_std::allocator<CigarEntry>_>).
           super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data
           ._M_finish._M_cur;
  while (entry != pCVar1) {
    Add(__return_storage_ptr__,entry);
    entry = entry + 1;
    if (entry == pCVar3) {
      entry = ppCVar2[1];
      ppCVar2 = ppCVar2 + 1;
      pCVar3 = entry + 0x40;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Cigar operator+( const Cigar& other ) const {
    Cigar ce = *this;
    for( auto& c : other )
      ce.Add( c );
    return ce;
  }